

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void pminuw_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Instruction).Category = 0x80000;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pminuw",7);
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
LAB_001270ee:
    failDecode(pMyDisasm);
    return;
  }
  UVar1 = (pMyDisasm->Reserved_).VEX.pp;
  if (UVar1 != '\x02') {
    if (UVar1 == '\x01') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpminuw",8);
      if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
      }
      ArgsVEX(pMyDisasm);
      return;
    }
    goto LAB_001270ee;
  }
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') goto LAB_001270ee;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpbroadcastmw2d",0x10);
  if ((pMyDisasm->Reserved_).EVEX.vvvv != '\x0f') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  (pMyDisasm->Instruction).Category = 0x140000;
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    IVar2 = 4;
  }
  else if (UVar1 == '\x01') {
    IVar2 = 8;
  }
  else {
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_0012710d;
    IVar2 = 0x10;
  }
  (pMyDisasm->Reserved_).Register_ = IVar2;
LAB_0012710d:
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 0x400;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  if ((pMyDisasm->Reserved_).MOD_ != 3) {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ pminuw_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpminuw");
      #endif
      if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
      ArgsVEX(pMyDisasm);
    }
    else if ((GV.VEX.pp == 2) && (GV.EVEX.state == InUsePrefix)) {
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpbroadcastmw2d");
      #endif
      if (GV.EVEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
      }
      else if (GV.VEX.L == 0x1) {
        GV.Register_ = AVX_REG;
      }
      else if (GV.EVEX.LL == 0x2) {
        GV.Register_ = AVX512_REG;
      }
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = OPMASK_REG;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      if (GV.MOD_ != 3) GV.ERROR_OPCODE = UD_;
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }

    else {
      failDecode(pMyDisasm);
    }
  }
   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       pMyDisasm->Instruction.Category = SSE41_INSTRUCTION;
       GV.MemDecoration = Arg2_m128_xmm;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pminuw");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);
       pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
  else {
    failDecode(pMyDisasm);
  }
}